

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void anon_unknown.dwarf_5292d::signal_handler(int signal)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream local_190 [8];
  ostringstream os;
  char *sigstr;
  int signal_local;
  
  pcVar1 = strsignal(signal);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"received signal ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,signal);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,")");
  std::__cxx11::ostringstream::str();
  pcVar1 = (char *)std::__cxx11::string::c_str();
  abnormal_program_termination(pcVar1);
}

Assistant:

void signal_handler(int signal) {
        const char* sigstr = strsignal(signal);
        std::ostringstream os;
        os << "received signal " << signal << " (" << sigstr << ")";
        abnormal_program_termination(os.str().c_str());
    }